

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_wd_add_leaf(lyd_node **tree,lyd_node *last_parent,lys_node_leaf *leaf,unres_data *unres,
                   int check_when_must)

{
  int iVar1;
  uint uVar2;
  lys_tpdf *plVar3;
  lyd_node *node;
  char *value;
  UNRES_ITEM type;
  lyd_node *node_00;
  
  value = leaf->dflt;
  if (value == (char *)0x0) {
    if (((leaf->flags & 0x40) == 0) && (plVar3 = (leaf->type).der, plVar3 != (lys_tpdf *)0x0)) {
      do {
        value = plVar3->dflt;
        plVar3 = (plVar3->type).der;
        if (plVar3 == (lys_tpdf *)0x0) break;
      } while (value == (char *)0x0);
    }
    else {
      value = (char *)0x0;
    }
  }
  if (value == (char *)0x0) {
    return 0;
  }
  node = lyd_new_dummy(*tree,last_parent,(lys_node *)leaf,value,1);
  if ((node != (lyd_node *)0x0) &&
     (((node_00 = node, node->parent != (lyd_node *)0x0 || (*tree == (lyd_node *)0x0)) ||
      (iVar1 = lyd_insert_common((*tree)->parent,tree,node,1), iVar1 == 0)))) {
    while( true ) {
      if ((check_when_must != 0) &&
         (((((node_00->field_0x9 & 8) != 0 &&
            (iVar1 = unres_data_add(unres,node_00,UNRES_WHEN), iVar1 == -1)) ||
           ((uVar2 = resolve_applies_must(node_00), (uVar2 & 1) != 0 &&
            (iVar1 = unres_data_add(unres,node_00,UNRES_MUST), iVar1 == -1)))) ||
          (((uVar2 & 2) != 0 &&
           (iVar1 = unres_data_add(unres,node_00,UNRES_MUST_INOUT), iVar1 == -1))))))
      goto LAB_001655ad;
      node_00->validity = node_00->validity & 0x7f;
      if ((lys_node_leaf *)node_00->schema == leaf) break;
      node_00 = node_00->child;
    }
    lyd_wd_update_parents(node);
    if (*(short *)&node_00[1].validity == 8) {
      type = UNRES_INSTID;
    }
    else {
      if (*(short *)&node_00[1].validity != 9) goto LAB_001655bd;
      type = UNRES_LEAFREF;
    }
    iVar1 = unres_data_add(unres,node_00,type);
    if (iVar1 == 0) {
LAB_001655bd:
      if (*tree == (lyd_node *)0x0) {
        *tree = node;
      }
      return 0;
    }
  }
LAB_001655ad:
  lyd_free(node);
  return 1;
}

Assistant:

static int
lyd_wd_add_leaf(struct lyd_node **tree, struct lyd_node *last_parent, struct lys_node_leaf *leaf, struct unres_data *unres,
                int check_when_must)
{
    struct lyd_node *dummy = NULL, *current;
    struct lys_tpdf *tpdf;
    const char *dflt = NULL;
    int ret;

    /* get know if there is a default value */
    if (leaf->dflt) {
        /* leaf has a default value */
        dflt = leaf->dflt;
    } else if (!(leaf->flags & LYS_MAND_TRUE)) {
        /* get the default value from the type */
        for (tpdf = leaf->type.der; tpdf && !dflt; tpdf = tpdf->type.der) {
            dflt = tpdf->dflt;
        }
    }
    if (!dflt) {
        /* no default value */
        return EXIT_SUCCESS;
    }

    /* create the node */
    if (!(dummy = lyd_new_dummy(*tree, last_parent, (struct lys_node*)leaf, dflt, 1))) {
        goto error;
    }
    if (!dummy->parent && (*tree)) {
        /* connect dummy nodes into the data tree (at the end of top level nodes) */
        if (lyd_insert_sibling(tree, dummy)) {
            goto error;
        }
    }
    for (current = dummy; ; current = current->child) {
        /* remember the created data in unres */
        if (check_when_must) {
            if ((current->when_status & LYD_WHEN) && unres_data_add(unres, current, UNRES_WHEN) == -1) {
                goto error;
            }
            ret = resolve_applies_must(current);
            if ((ret & 0x1) && (unres_data_add(unres, current, UNRES_MUST) == -1)) {
                goto error;
            }
            if ((ret & 0x2) && (unres_data_add(unres, current, UNRES_MUST_INOUT) == -1)) {
                goto error;
            }
        }

        /* clear dummy-node flag */
        current->validity &= ~LYD_VAL_INUSE;

        if (current->schema == (struct lys_node *)leaf) {
            break;
        }
    }
    /* update parent's default flag if needed */
    lyd_wd_update_parents(dummy);

    /* if necessary, remember the created data value in unres */
    if (((struct lyd_node_leaf_list *)current)->value_type == LY_TYPE_LEAFREF) {
        if (unres_data_add(unres, current, UNRES_LEAFREF)) {
            goto error;
        }
    } else if (((struct lyd_node_leaf_list *)current)->value_type == LY_TYPE_INST) {
        if (unres_data_add(unres, current, UNRES_INSTID)) {
            goto error;
        }
    }

    if (!(*tree)) {
        *tree = dummy;
    }
    return EXIT_SUCCESS;

error:
    lyd_free(dummy);
    return EXIT_FAILURE;
}